

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

void monster_add_to_group(chunk *c,monster *mon,monster_group_conflict *group)

{
  mon_group_list_entry_conflict *pmVar1;
  mon_group_list_entry_conflict *list_entry;
  monster_group_conflict *group_local;
  monster *mon_local;
  chunk *c_local;
  
  if (mon->group_info[0].index == group->index) {
    pmVar1 = (mon_group_list_entry_conflict *)mem_zalloc(0x10);
    pmVar1->midx = mon->midx;
    pmVar1->next = group->member_list;
    group->member_list = pmVar1;
    return;
  }
  __assert_fail("mon->group_info[PRIMARY_GROUP].index == group->index",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-group.c"
                ,0xe6,
                "void monster_add_to_group(struct chunk *, struct monster *, struct monster_group *)"
               );
}

Assistant:

void monster_add_to_group(struct chunk *c, struct monster *mon,
						  struct monster_group *group)
{
	struct mon_group_list_entry *list_entry;

	/* Confirm we're adding to the right group */
	assert(mon->group_info[PRIMARY_GROUP].index == group->index);

	/* Make a new list entry and add it to the start of the list */
	list_entry = mem_zalloc(sizeof(struct mon_group_list_entry));
	list_entry->midx = mon->midx;
	list_entry->next = group->member_list;
	group->member_list = list_entry;
}